

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StandardChars.h
# Opt level: O1

void __thiscall
UnifiedRegex::CaseMapper<UnifiedRegex::CaseMapper<UnifiedRegex::TrivialCaseMapper>_>::CaseMapper
          (CaseMapper<UnifiedRegex::CaseMapper<UnifiedRegex::TrivialCaseMapper>_> *this,
          ArenaAllocator *allocator,MappingSource mappingSource,
          CaseMapper<UnifiedRegex::TrivialCaseMapper> *fallbackMapper)

{
  char16 cVar1;
  code *pcVar2;
  bool bVar3;
  int i;
  undefined4 *puVar4;
  long lVar5;
  uint l;
  uint uVar6;
  ulong v;
  char16 local_44 [4];
  char16 equivl [4];
  uint tblidx;
  uint acth;
  
  (this->toEquivs).isInMap.data[2].word = 0;
  (this->toEquivs).isInMap.data[3].word = 0;
  (this->toEquivs).isInMap.data[0].word = 0;
  (this->toEquivs).isInMap.data[1].word = 0;
  (this->toEquivs).defv = 0xffffffffffffffff;
  (this->toEquivs).root = (Type)0x0;
  memset((this->toEquivs).directMap,0xff,0x800);
  this->fallbackMapper = fallbackMapper;
  equivl[0] = L'\0';
  equivl[1] = L'\0';
  l = 0;
  puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
  equivl._4_4_ = ZEXT14(mappingSource);
  do {
    bVar3 = CaseInsensitive::RangeToEquivClassOnlyInSource
                      ((MappingSource)equivl._4_4_,(uint *)equivl,l,0xffff,&tblidx,local_44);
    uVar6 = l;
    if (bVar3) {
      do {
        lVar5 = 3;
        v = 0;
        do {
          cVar1 = local_44[lVar5];
          local_44[lVar5] = cVar1 + L'\x01';
          v = v << 0x10 | (ulong)(ushort)cVar1;
          bVar3 = lVar5 != 0;
          lVar5 = lVar5 + -1;
        } while (bVar3);
        if (0xffff < uVar6) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar4 = 1;
          bVar3 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/Chars.h"
                             ,0x89,"(u <= MaxUChar)","u <= MaxUChar");
          if (!bVar3) {
            pcVar2 = (code *)invalidInstructionException();
            (*pcVar2)();
          }
          *puVar4 = 0;
        }
        l = uVar6 + 1;
        CharMap<char16_t,_unsigned_long,_(UnifiedRegex::CharMapScheme)1>::Set
                  (&this->toEquivs,allocator,(Char)uVar6,v);
        uVar6 = l;
      } while (l <= tblidx);
    }
    else {
      l = tblidx + 1;
    }
  } while (l < 0x10000);
  return;
}

Assistant:

CaseMapper(ArenaAllocator *allocator, CaseInsensitive::MappingSource mappingSource, const FallbackCaseMapper *fallbackMapper) :
            toEquivs((uint64) -1),
            fallbackMapper(fallbackMapper)
        {
            CompileAssert(sizeof(char16) == 2);
            CompileAssert(sizeof(uint) > sizeof(char16));

            const uint maxUChar = Chars<char16>::MaxUChar;
            uint l = 0;
            uint h = maxUChar;
            uint tblidx = 0;
            do {
                uint acth;
                char16 equivl[CaseInsensitive::EquivClassSize];
                bool isNonTrivial = CaseInsensitive::RangeToEquivClassOnlyInSource(mappingSource, tblidx, l, h, acth, equivl);
                if (isNonTrivial)
                {
                    __assume(acth <= maxUChar); // property of algorithm: acth never greater than h
                    do
                    {
                        uint64 r = 0;
                        CompileAssert(sizeof(r) >= sizeof(char16) * CaseInsensitive::EquivClassSize);

                        for (int i = CaseInsensitive::EquivClassSize - 1; i >= 0; i--)
                        {
                            __assume(equivl[i] <= maxUChar); // property of algorithm: never map outside of range
                            r <<= 16;
                            r |= Chars<char16>::CTU(equivl[i]++);
                        }
                        toEquivs.Set(allocator, Chars<char16>::UTC(l++), r);
                    }
                    while (l <= acth);
                }
                else
                {
                    l = acth + 1;
                }
            }
            while (l <= h);
        }